

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *puVar1;
  uint uVar2;
  pointer ppVar3;
  pointer pcVar4;
  cmCTest *pcVar5;
  cmCTestTestHandler *this_00;
  cmCTestTestProperties *pcVar6;
  pointer ppVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Exception EVar11;
  int iVar12;
  size_t sVar13;
  long *plVar14;
  ostream *poVar15;
  undefined7 in_register_00000009;
  ulong *puVar16;
  size_type *psVar17;
  long lVar18;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pass;
  pointer ppVar19;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  double dVar23;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string output;
  string testName;
  string reason;
  ostringstream cmCTestLog_msg_1;
  ostringstream outputStream;
  char buf [1024];
  byte local_7e4;
  string local_7d8;
  int local_7b4;
  string local_7b0;
  size_t local_790;
  size_t local_788;
  char *local_780;
  char *local_778;
  char local_770;
  undefined7 uStack_76f;
  State local_75c;
  ulong local_758;
  unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *local_750;
  undefined1 local_748 [112];
  ios_base local_6d8 [264];
  long *local_5d0;
  long local_5c0 [2];
  undefined1 local_5b0 [8];
  undefined1 *local_5a8;
  undefined1 local_5a0 [96];
  ios_base local_540 [264];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  undefined8 local_418;
  undefined1 *local_410;
  ios_base local_3c8 [920];
  
  local_790 = completed;
  local_788 = total;
  WriteLogOutputTop(this,completed,total);
  local_780 = &local_770;
  local_778 = (char *)0x0;
  local_770 = '\0';
  local_75c = Error;
  local_7b4 = (int)CONCAT71(in_register_00000009,started);
  if (local_7b4 != 0) {
    local_75c = cmProcess::GetProcessStatus
                          ((this->TestProcess)._M_t.
                           super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                           super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                           super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
  }
  if (local_75c != Expired) {
    this->TimeoutIsForStopTime = false;
  }
  local_758 = ((this->TestProcess)._M_t.
               super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
               super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->ExitValue;
  ppVar19 = (this->TestProperties->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->TestProperties->RequiredRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar19 == ppVar3) {
LAB_001e00dc:
    bVar10 = false;
  }
  else {
    bVar10 = false;
    if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar10 = false;
      do {
        ppVar7 = ppVar19 + 1;
        bVar8 = cmsys::RegularExpression::find
                          (&ppVar19->first,(this->ProcessOutput)._M_dataplus._M_p,
                           (RegularExpressionMatch *)ppVar19);
        if (bVar8) {
          local_428._8_8_ = (ppVar19->second)._M_dataplus._M_p;
          local_428._M_allocated_capacity = (ppVar19->second)._M_string_length;
          local_438._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x2a;
          local_438._8_8_ = "Required regular expression found. Regex=[";
          local_5b0 = (undefined1  [8])&DAT_00000001;
          local_5a8 = local_5a0;
          local_5a0[0] = 0x5d;
          local_418 = 1;
          views._M_len = 3;
          views._M_array = (iterator)local_438;
          local_410 = local_5a8;
          cmCatViews_abi_cxx11_((string *)local_748,views);
          std::__cxx11::string::operator=((string *)&local_780,(string *)local_748);
          if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
            operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
          }
          bVar10 = true;
        }
        ppVar19 = ppVar7;
      } while (!bVar8 && ppVar7 != ppVar3);
      if (bVar10) goto LAB_001e00dc;
      std::__cxx11::string::_M_replace((ulong)&local_780,0,local_778,0x75675a);
      ppVar19 = (this->TestProperties->RequiredRegularExpressions).
                super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->TestProperties->RequiredRegularExpressions).
               super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar19 != ppVar3) {
        do {
          std::__cxx11::string::_M_append
                    ((char *)&local_780,(ulong)(ppVar19->second)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_780);
          ppVar19 = ppVar19 + 1;
        } while (ppVar19 != ppVar3);
      }
      bVar10 = true;
      std::__cxx11::string::append((char *)&local_780);
    }
  }
  ppVar19 = (this->TestProperties->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->TestProperties->ErrorRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppVar19 != ppVar3) &&
     ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    do {
      ppVar7 = ppVar19 + 1;
      bVar8 = cmsys::RegularExpression::find
                        (&ppVar19->first,(this->ProcessOutput)._M_dataplus._M_p,
                         (RegularExpressionMatch *)ppVar19);
      if (bVar8) {
        local_428._8_8_ = (ppVar19->second)._M_dataplus._M_p;
        local_428._M_allocated_capacity = (ppVar19->second)._M_string_length;
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x31;
        local_438._8_8_ = "Error regular expression found in output. Regex=[";
        local_5b0 = (undefined1  [8])&DAT_00000001;
        local_5a0[0] = 0x5d;
        local_418 = 1;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_438;
        local_5a8 = local_5a0;
        local_410 = local_5a0;
        cmCatViews_abi_cxx11_((string *)local_748,views_00);
        std::__cxx11::string::operator=((string *)&local_780,(string *)local_748);
        if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
        bVar10 = true;
      }
      ppVar19 = ppVar7;
    } while (!bVar8 && ppVar7 != ppVar3);
  }
  ppVar19 = (this->TestProperties->SkipRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->TestProperties->SkipRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = false;
  if ((ppVar19 != ppVar3) &&
     (bVar8 = false,
     (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    bVar8 = false;
    do {
      ppVar7 = ppVar19 + 1;
      bVar9 = cmsys::RegularExpression::find
                        (&ppVar19->first,(this->ProcessOutput)._M_dataplus._M_p,
                         (RegularExpressionMatch *)ppVar19);
      if (bVar9) {
        local_428._8_8_ = (ppVar19->second)._M_dataplus._M_p;
        local_428._M_allocated_capacity = (ppVar19->second)._M_string_length;
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x30;
        local_438._8_8_ = "Skip regular expression found in output. Regex=[";
        local_5b0 = (undefined1  [8])&DAT_00000001;
        local_5a8 = local_5a0;
        local_5a0[0] = 0x5d;
        local_418 = 1;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_438;
        local_410 = local_5a8;
        cmCatViews_abi_cxx11_((string *)local_748,views_01);
        std::__cxx11::string::operator=((string *)&local_780,(string *)local_748);
        if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
        bVar8 = true;
      }
      ppVar19 = ppVar7;
    } while (!bVar9 && ppVar7 != ppVar3);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  puVar1 = &this->TestProcess;
  local_750 = puVar1;
  if (local_75c == Exception) {
    bVar10 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Exception: ",0xe);
    cmProcess::GetExitExceptionString_abi_cxx11_
              ((string *)local_438,
               (puVar1->_M_t).super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t
               .super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).ExceptionStatus,(string *)local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != &local_428) {
      operator_delete((void *)local_438._0_8_,local_428._M_allocated_capacity + 1);
    }
    EVar11 = cmProcess::GetExitException
                       ((puVar1->_M_t).
                        super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                        super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                        super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    switch(EVar11) {
    case Fault:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"SegFault",8);
      (this->TestResult).Status = 2;
      break;
    case Illegal:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Illegal",7);
      (this->TestResult).Status = 3;
      break;
    case Interrupt:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Interrupt",9);
      (this->TestResult).Status = 4;
      break;
    case Numerical:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Numerical",9);
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,(this->TestResult).ExceptionStatus._M_dataplus._M_p,
                 (this->TestResult).ExceptionStatus._M_string_length);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xd8,(char *)local_748._0_8_,false);
      if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 6;
    }
  }
  else if (local_75c == Expired) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Timeout ",0xb);
    (this->TestResult).Status = 1;
    bVar10 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
  }
  else {
    if (local_75c == Exited) {
      bVar9 = false;
      if (!bVar10) {
        if (local_758 == 0) {
          bVar9 = true;
        }
        else {
          bVar9 = (this->TestProperties->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (this->TestProperties->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar2 = this->TestProperties->SkipReturnCode;
      if ((bool)((local_758 == uVar2 && -1 < (int)uVar2) | bVar8)) {
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        if (bVar8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,"SKIP_REGULAR_EXPRESSION_MATCHED",0x1f);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,"SKIP_RETURN_CODE=",0x11);
          std::ostream::operator<<(local_438,this->TestProperties->SkipReturnCode);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,(string *)local_748);
        if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
          operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Skipped ",0xb);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        std::ios_base::~ios_base(local_3c8);
        local_7e4 = 1;
        bVar10 = false;
        goto LAB_001e0567;
      }
      if (bVar9 == this->TestProperties->WillFail) {
        (this->TestResult).Status = 7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"***Failed  ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5b0,local_780,(long)local_778);
        bVar10 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
        goto LAB_001e055f;
      }
      (this->TestResult).Status = 9;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"   Passed  ",0xb);
    }
    else {
      iVar12 = std::__cxx11::string::compare((char *)&(this->TestResult).CompletionStatus);
      pcVar21 = "***Not Run ";
      if (iVar12 == 0) {
        pcVar21 = "***Not Run (Disabled) ";
      }
      lVar18 = 0xb;
      if (iVar12 == 0) {
        lVar18 = 0x16;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,pcVar21,lVar18);
    }
    bVar10 = false;
  }
LAB_001e055f:
  local_7e4 = 0;
LAB_001e0567:
  iVar12 = (this->TestResult).Status;
  snprintf(local_438,0x400,"%6.2f sec",
           SUB84((((this->TestProcess)._M_t.
                   super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                   super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                   super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->TotalTime).__r,0));
  sVar13 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,local_438,sVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"\n",1);
  bVar8 = cmCTest::GetTestProgressOutput(this->CTest);
  bVar9 = (bool)(iVar12 == 9 | local_7e4);
  if (bVar8) {
    if (bVar9 == false) {
      GetTestPrefix_abi_cxx11_(&local_7d8,this,local_790,local_788);
      pcVar4 = (this->TestProperties->Name)._M_dataplus._M_p;
      local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7b0,pcVar4,pcVar4 + (this->TestProperties->Name)._M_string_length)
      ;
      iVar12 = cmCTest::GetMaxTestNameWidth(this->CTest);
      std::__cxx11::string::resize((ulong)&local_7b0,(char)iVar12 + '\x04');
      std::__cxx11::string::_M_append((char *)&local_7d8,(ulong)local_7b0._M_dataplus._M_p);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_7d8,local_748._0_8_);
      puVar16 = (ulong *)(local_748 + 0x10);
      if ((ulong *)local_748._0_8_ != puVar16) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      local_748._0_8_ = puVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"");
      std::__cxx11::stringbuf::str((string *)&local_5a8);
      if ((ulong *)local_748._0_8_ != puVar16) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      std::ios::clear((int)(ostream *)local_5b0 + (int)*(_func_int **)((long)local_5b0 + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,local_7d8._M_dataplus._M_p,local_7d8._M_string_length);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_748,"\n",1);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf6,(char *)local_5d0,false);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0,local_5c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
      std::ios_base::~ios_base(local_6d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_790 == local_788) {
      GetTestPrefix_abi_cxx11_(&local_7b0,this,local_790,local_788);
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_7b0,
                                   (ulong)(this->TestProperties->Name)._M_dataplus._M_p);
      puVar16 = (ulong *)(plVar14 + 2);
      if ((ulong *)*plVar14 == puVar16) {
        local_748._16_8_ = *puVar16;
        local_748._24_8_ = plVar14[3];
        local_748._0_8_ = local_748 + 0x10;
      }
      else {
        local_748._16_8_ = *puVar16;
        local_748._0_8_ = (ulong *)*plVar14;
      }
      local_748._8_8_ = plVar14[1];
      *plVar14 = (long)puVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append(local_748);
      psVar17 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_7d8.field_2._M_allocated_capacity = *psVar17;
        local_7d8.field_2._8_8_ = plVar14[3];
        local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
      }
      else {
        local_7d8.field_2._M_allocated_capacity = *psVar17;
        local_7d8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_7d8._M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
        operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_748,local_7d8._M_dataplus._M_p,local_7d8._M_string_length);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfb,local_7b0._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
      std::ios_base::~ios_base(local_6d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar8 = cmCTest::GetTestProgressOutput(this->CTest);
  if ((bVar8 & bVar9) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_748,local_7d8._M_dataplus._M_p,local_7d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xff,local_7d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
    std::ios_base::~ios_base(local_6d8);
  }
  if (bVar10 != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_748,(this->ProcessOutput)._M_dataplus._M_p,
                         (this->ProcessOutput)._M_string_length);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    pcVar5 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x103,local_7d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
    std::ios_base::~ios_base(local_6d8);
  }
  poVar15 = this->TestHandler->LogFile;
  if (poVar15 != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Test time = ",0xc);
    sVar13 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_438,sVar13);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  ParseOutputForMeasurements(this);
  if (((char)local_7b4 != '\0') && (this_00 = this->TestHandler, this_00->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_00,&this->ProcessOutput,
               (long)(&this_00->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9],
               this_00->TestOutputTruncation);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Reason);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar12 = (this->TestResult).Status;
    pcVar21 = "Test Pass Reason";
    pcVar22 = "Test Passed.\n";
    if ((iVar12 != 0) && (iVar12 != 9)) {
      pcVar21 = "Test Fail Reason";
      pcVar22 = "Test Failed.\n";
    }
    dVar23 = (((this->TestProcess)._M_t.
               super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
               super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->TotalTime).__r;
    lVar18 = (long)(dVar23 / 3600.0);
    dVar23 = dVar23 - (double)lVar18 * 3600.0;
    lVar20 = (long)(dVar23 / 60.0);
    snprintf(local_748,100,"%02d:%02d:%02d",lVar18,lVar20,(long)(dVar23 - (double)lVar20 * 60.0));
    poVar15 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    poVar15 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length == 0) {
      lVar18 = 0xd;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar21,0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,":\n",2);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(this->TestResult).Reason._M_dataplus._M_p,
                           (this->TestResult).Reason._M_string_length);
      lVar18 = 1;
      pcVar22 = "\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar22,lVar18);
    poVar15 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" end time: ",0xc);
    cmCTest::CurrentTime_abi_cxx11_(&local_7d8,this->CTest);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_7d8._M_dataplus._M_p,local_7d8._M_string_length);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    poVar15 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" time elapsed: ",0x10);
    sVar13 = strlen(local_748);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_748,sVar13);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    poVar15 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    plVar14 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
    std::ostream::put((char)plVar14);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)local_7b4 != '\0') {
    puVar16 = (ulong *)(local_748 + 0x10);
    local_748._8_8_ = 0;
    local_748._16_8_ = local_748._16_8_ & 0xffffffffffffff00;
    local_748._0_8_ = puVar16;
    if ((this->TestHandler->MemCheck == false) &&
       (bVar10 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar10)) {
      pcVar4 = (this->ProcessOutput)._M_dataplus._M_p;
      local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7d8,pcVar4,pcVar4 + (this->ProcessOutput)._M_string_length);
      bVar10 = cmCTest::CompressString(this->CTest,&local_7d8);
      if (bVar10) {
        std::__cxx11::string::operator=((string *)local_748,(string *)&local_7d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar8 = local_748._8_8_ != 0;
    bVar10 = (ulong)local_748._8_8_ < (this->ProcessOutput)._M_string_length;
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = bVar10 && bVar8;
    (this->TestResult).ReturnValue =
         ((this->TestProcess)._M_t.super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>
          ._M_t.super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
          super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->ExitValue;
    if (local_7e4 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->TestResult).CompletionStatus,0,
                 (char *)(this->TestResult).CompletionStatus._M_string_length,0x74ed06);
    }
    (this->TestResult).ExecutionTime.__r =
         (((this->TestProcess)._M_t.
           super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
           super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
           super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->TotalTime).__r;
    MemCheckPostProcess(this);
    if ((this->TestResult).Status == 9) {
      pcVar6 = this->TestProperties;
      dVar23 = (double)pcVar6->PreviousRuns;
      pcVar6->Cost = (float)(((double)pcVar6->Cost * dVar23 + (this->TestResult).ExecutionTime.__r)
                            / (dVar23 + 1.0));
      pcVar6->PreviousRuns = pcVar6->PreviousRuns + 1;
    }
    if ((ulong *)local_748._0_8_ != puVar16) {
      operator_delete((void *)local_748._0_8_,local_748._16_8_ + 1);
    }
  }
  bVar10 = NeedsToRepeat(this);
  if (!bVar10) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
            ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)local_750,(pointer)0x0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if (local_780 != &local_770) {
    operator_delete(local_780,CONCAT71(uStack_76f,local_770) + 1);
  }
  return bVar9;
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  cmProcess::State res =
    started ? this->TestProcess->GetProcessStatus() : cmProcess::State::Error;
  if (res != cmProcess::State::Expired) {
    this->TimeoutIsForStopTime = false;
  }
  std::int64_t retVal = this->TestProcess->GetExitValue();
  bool forceFail = false;
  bool forceSkip = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
      if (pass.first.find(this->ProcessOutput)) {
        found = true;
        reason = cmStrCat("Required regular expression found. Regex=[",
                          pass.second, ']');
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found. Regex=[";
      for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
        reason += pass.second;
        reason += "\n";
      }
      reason += "]";
      forceFail = true;
    }
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& fail : this->TestProperties->ErrorRegularExpressions) {
      if (fail.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Error regular expression found in output. Regex=[",
                          fail.second, ']');
        forceFail = true;
        break;
      }
    }
  }
  if (!this->TestProperties->SkipRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& skip : this->TestProperties->SkipRegularExpressions) {
      if (skip.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Skip regular expression found in output. Regex=[",
                          skip.second, ']');
        forceSkip = true;
        break;
      }
    }
  }
  std::ostringstream outputStream;
  if (res == cmProcess::State::Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if ((this->TestProperties->SkipReturnCode >= 0 &&
         this->TestProperties->SkipReturnCode == retVal) ||
        forceSkip) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      if (forceSkip) {
        s << "SKIP_REGULAR_EXPRESSION_MATCHED";
      } else {
        s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      }
      this->TestResult.CompletionStatus = s.str();
      outputStream << "***Skipped ";
      skipped = true;
    } else if (success != this->TestProperties->WillFail) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      outputStream << "   Passed  ";
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      outputStream << "***Failed  " << reason;
      outputTestErrorsToConsole =
        this->CTest->GetOutputTestOutputOnTestFailure();
    }
  } else if (res == cmProcess::State::Expired) {
    outputStream << "***Timeout ";
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
  } else if (res == cmProcess::State::Exception) {
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
    outputStream << "***Exception: ";
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmProcess::Exception::Fault:
        outputStream << "SegFault";
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmProcess::Exception::Illegal:
        outputStream << "Illegal";
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmProcess::Exception::Interrupt:
        outputStream << "Interrupt";
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmProcess::Exception::Numerical:
        outputStream << "Numerical";
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    outputStream << "***Not Run (Disabled) ";
  } else // cmProcess::State::Error
  {
    outputStream << "***Not Run ";
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  snprintf(buf, sizeof(buf), "%6.2f sec",
           this->TestProcess->GetTotalTime().count());
  outputStream << buf << "\n";

  bool passedOrSkipped = passed || skipped;
  if (this->CTest->GetTestProgressOutput()) {
    if (!passedOrSkipped) {
      // If the test did not pass, reprint test name and error
      std::string output = this->GetTestPrefix(completed, total);
      std::string testName = this->TestProperties->Name;
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      testName.resize(maxTestNameWidth + 4, '.');

      output += testName;
      output += outputStream.str();
      outputStream.str("");
      outputStream.clear();
      outputStream << output;
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, "\n"); // flush
    }
    if (completed == total) {
      std::string testName = this->GetTestPrefix(completed, total) +
        this->TestProperties->Name + "\n";
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
    }
  }
  if (!this->CTest->GetTestProgressOutput() || !passedOrSkipped) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  this->ParseOutputForMeasurements();

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize),
      this->TestHandler->TestOutputTruncation);
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    auto ttime = this->TestProcess->GetTotalTime();
    auto hours = std::chrono::duration_cast<std::chrono::hours>(ttime);
    ttime -= hours;
    auto minutes = std::chrono::duration_cast<std::chrono::minutes>(ttime);
    ttime -= minutes;
    auto seconds = std::chrono::duration_cast<std::chrono::seconds>(ttime);
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%02d:%02d:%02d",
             static_cast<unsigned>(hours.count()),
             static_cast<unsigned>(minutes.count()),
             static_cast<unsigned>(seconds.count()));
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    std::string compressedOutput;
    if (!this->TestHandler->MemCheck &&
        this->CTest->ShouldCompressTestOutput()) {
      std::string str = this->ProcessOutput;
      if (this->CTest->CompressString(str)) {
        compressedOutput = std::move(str);
      }
    }
    bool compress = !compressedOutput.empty() &&
      compressedOutput.length() < this->ProcessOutput.length();
    this->TestResult.Output =
      compress ? compressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRepeat()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  this->TestProcess.reset();
  return passed || skipped;
}